

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
NewInitialized(ScriptContext *scriptContext,SimplePropertyDescriptor *propertyDescriptors,
              int propertyCount,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,bool isLocked,
              bool isShared)

{
  Recycler *pRVar1;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this;
  TrackAllocData local_50;
  byte local_22;
  byte local_21;
  uint16 local_20;
  uint16 local_1e;
  bool isShared_local;
  int iStack_1c;
  bool isLocked_local;
  uint16 offsetOfInlineSlots_local;
  uint16 inlineSlotCapacity_local;
  int propertyCount_local;
  SimplePropertyDescriptor *propertyDescriptors_local;
  ScriptContext *scriptContext_local;
  
  local_22 = isShared;
  local_21 = isLocked;
  local_20 = offsetOfInlineSlots;
  local_1e = inlineSlotCapacity;
  iStack_1c = propertyCount;
  _offsetOfInlineSlots_local = propertyDescriptors;
  propertyDescriptors_local = (SimplePropertyDescriptor *)scriptContext;
  PropertyIndexRangesBase<Js::PropertyIndexRanges<unsigned_short>_>::VerifySlotCapacity
            (propertyCount);
  pRVar1 = ScriptContext::GetRecycler((ScriptContext *)propertyDescriptors_local);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,
             (type_info *)
             &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
              typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
             ,0x102);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  this = (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *)
         new<Memory::Recycler>(0x30,pRVar1,0x43c4b0);
  SimpleDictionaryTypeHandlerBase
            (this,(ScriptContext *)propertyDescriptors_local,_offsetOfInlineSlots_local,iStack_1c,
             iStack_1c,local_1e,local_20,(bool)(local_21 & 1),(bool)(local_22 & 1),true);
  return this;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> * SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::NewInitialized(ScriptContext * scriptContext, SimplePropertyDescriptor const* propertyDescriptors, int propertyCount, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared)
    {
        PropertyIndexRangesType::VerifySlotCapacity(propertyCount);
        return RecyclerNew(scriptContext->GetRecycler(), SimpleDictionaryTypeHandlerBase, scriptContext, propertyDescriptors, propertyCount, propertyCount, inlineSlotCapacity, offsetOfInlineSlots, isLocked, isShared, true);
    }